

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

size_t __thiscall FIX::FieldMap::totalFields(FieldMap *this)

{
  bool bVar1;
  reference ppVar2;
  reference ppFVar3;
  size_t sVar4;
  FieldMap **group;
  const_iterator __end2;
  const_iterator __begin2;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *__range2;
  pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_> *tagWithGroups;
  const_iterator __end1;
  const_iterator __begin1;
  Groups *__range1;
  size_t result;
  FieldMap *this_local;
  
  __range1 = (Groups *)
             std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::size(&this->m_fields);
  __end1 = std::
           map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
           ::begin(&this->m_groups);
  tagWithGroups =
       (pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_> *)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::end(&this->m_groups);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&tagWithGroups);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator*(&__end1);
    __end2 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin(&ppVar2->second);
    group = (FieldMap **)
            std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&ppVar2->second);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                                  *)&group);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::operator*(&__end2);
      sVar4 = totalFields(*ppFVar3);
      __range1 = (Groups *)(&(__range1->_M_t)._M_impl.field_0x0 + sVar4);
      __gnu_cxx::
      __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
    ::operator++(&__end1);
  }
  return (size_t)__range1;
}

Assistant:

size_t FieldMap::totalFields() const {
  size_t result = m_fields.size();

  for (auto const &tagWithGroups : m_groups) {
    for (auto const &group : tagWithGroups.second) {
      result += group->totalFields();
    }
  }
  return result;
}